

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::Train(Qclass *this)

{
  int iVar1;
  int iVar2;
  uint x;
  int y;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint lastAction;
  ostream *poVar7;
  int iVar8;
  int j;
  ulong uVar9;
  long lVar10;
  double (*padVar11) [4];
  int i;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint local_38;
  uint local_34;
  
  createGrid(this);
  iVar5 = rand();
  uVar12 = (long)iVar5 % 0x32 & 0xffffffff;
  iVar6 = rand();
  uVar14 = (long)iVar6 % 0x32 & 0xffffffff;
  iVar1 = this->goal_x;
  iVar2 = this->goal_y;
  if (this->grid[(int)((long)iVar5 % 0x32)][(int)((long)iVar6 % 0x32)] == 1) {
    for (iVar5 = 1; iVar5 == 1;
        iVar5 = this->grid[(int)((long)iVar5 % 0x32)][(int)((long)iVar6 % 0x32)]) {
      iVar5 = rand();
      uVar12 = (long)iVar5 % 0x32 & 0xffffffff;
      iVar6 = rand();
      uVar14 = (long)iVar6 % 0x32 & 0xffffffff;
    }
  }
  bVar4 = true;
  iVar5 = (int)uVar12 * 0x32 + (int)uVar14;
  local_34 = 0;
  local_38 = 0;
  for (iVar6 = 0; iVar6 != 50000; iVar6 = iVar6 + 1) {
    iVar8 = 0;
    lastAction = 0;
    while (iVar8 != iVar1 * 0x32 + iVar2) {
      uVar9 = uVar14;
      if (!bVar4) {
        x = (uint)uVar12;
        if (lastAction == 0) {
          local_34 = x + 1;
        }
        uVar3 = x - 1;
        if (lastAction != 1) {
          uVar3 = local_34;
        }
        y = (int)uVar14;
        uVar9 = (ulong)local_38;
        if (lastAction < 2) {
          uVar9 = uVar14;
        }
        if (lastAction == 2) {
          uVar9 = (ulong)(y + 1);
        }
        local_34 = uVar3;
        if ((lastAction & 0xfffffffe) == 2) {
          local_34 = x;
        }
        if (lastAction == 3) {
          uVar9 = (ulong)(y - 1);
        }
        local_38 = (uint)uVar9;
        iVar5 = local_34 * 0x32 + local_38;
        Qupdate(this,lastAction,iVar8,x,y,iVar5);
        uVar12 = (ulong)local_34;
      }
      iVar8 = iVar5;
      lastAction = detAction(this,iVar8);
      bVar4 = false;
      uVar14 = uVar9;
      iVar5 = iVar8;
      if (this->restart == true) {
        this->restart = false;
        iVar5 = rand();
        uVar12 = (long)iVar5 % 0x32 & 0xffffffff;
        iVar8 = rand();
        uVar14 = (long)iVar8 % 0x32 & 0xffffffff;
        if (this->grid[(int)((long)iVar5 % 0x32)][(int)((long)iVar8 % 0x32)] == 1) {
          for (iVar5 = 1; iVar5 == 1;
              iVar5 = this->grid[(int)((long)iVar5 % 0x32)][(int)((long)iVar8 % 0x32)]) {
            iVar5 = rand();
            uVar12 = (long)iVar5 % 0x32 & 0xffffffff;
            iVar8 = rand();
            uVar14 = (long)iVar8 % 0x32 & 0xffffffff;
          }
        }
        iVar8 = (int)uVar12 * 0x32 + (int)uVar14;
        lastAction = detAction(this,iVar8);
        bVar4 = true;
        iVar5 = iVar8;
      }
    }
  }
  padVar11 = this->Q;
  for (lVar13 = 0; lVar13 != 0x9c4; lVar13 = lVar13 + 1) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar13);
    std::operator<<(poVar7,"  ");
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      poVar7 = std::ostream::_M_insert<double>((*padVar11)[lVar10]);
      std::operator<<(poVar7,"  ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    padVar11 = padVar11 + 1;
  }
  return 0;
}

Assistant:

int Qclass::Train() {
  Qclass::createGrid();
  int initialTrial = 1;
  int new_x = 0;
  int action = 0;
  int new_y = 0;
  int new_state = 0;
  int start_x = rand() % 50;
  int start_y = rand() % 50;
  int goal_state = findState(goal_x, goal_y);
  if (grid[start_x][start_y] == 1) {
    while (grid[start_x][start_y] == 1) {
      start_x = rand() % 50;
      start_y = rand() % 50;
    }
  }
  int prev_x = start_x;
  int prev_y = start_y;
  int state = findState(start_x, start_y);
  for (int k = 0; k < 50000; k++) {
    int lastState = 0;
    int lastAction = 0;
    while (lastState != goal_state) {
      // Skips this loop for first run as there are no previous nodes
      if (initialTrial == 0) {
        if (lastAction == 0) {
          new_x = prev_x + 1;
          new_y = prev_y;
        }
        if (lastAction == 1) {
          new_x = prev_x - 1;
          new_y = prev_y;
        }
        if (lastAction == 2) {
          new_x = prev_x;
          new_y = prev_y + 1;
        }
        if (lastAction == 3) {
          new_x = prev_x;
          new_y = prev_y - 1;
        }
        new_state = findState(new_x, new_y);
        Qupdate(lastAction, lastState, prev_x, prev_y, new_state);
        prev_x = new_x;
        prev_y = new_y;
        state = findState(prev_x, prev_y);
      }
      action = detAction(state);
      lastState = state;
      lastAction = action;
      initialTrial = 0;
      // Reinitialize all the training data whenever a collision occurs
      if (restart == true) {
        restart = false;
        initialTrial = 1;
        int start_x = rand() % 50;
        int start_y = rand() % 50;
        if (grid[start_x][start_y] == 1) {
          while (grid[start_x][start_y] == 1) {
            start_x = rand() % 50;
            start_y = rand() % 50;
          }
        }
        prev_x = start_x;
        prev_y = start_y;
        state = findState(start_x, start_y);
        action = detAction(state);
        lastState = state;
        lastAction = action;
      }
    }
  }
  // Outputting the Q table for 2500 states and 4 actions
  for (int i = 0; i < 2500; i++) {
    std::cout << i << "  ";
    for (int j = 0; j < 4; j++) {
      std::cout << Q[i][j] << "  ";
    }
    std::cout << std::endl;
  }
  return 0;
}